

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall Lowerer::GenerateFastIsInst(Lowerer *this,Instr *instr)

{
  Opnd *pOVar1;
  _func_int *p_Var2;
  Opnd *pOVar3;
  code *pcVar4;
  OpndKind OVar5;
  bool bVar6;
  uint32 uVar7;
  int iVar8;
  LabelInstr *target;
  LabelInstr *labelTarget;
  RegOpnd *baseOpnd;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar9;
  intptr_t iVar10;
  undefined4 extraout_var;
  AddrOpnd *src;
  RegOpnd *pRVar11;
  MemRefOpnd *pMVar12;
  IndirOpnd *pIVar13;
  IntConstOpnd *pIVar14;
  Lowerer *pLVar15;
  
  target = IR::LabelInstr::New(Label,this->m_func,true);
  labelTarget = IR::LabelInstr::New(Label,this->m_func,false);
  baseOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
  this_00 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
  pIVar14 = (IntConstOpnd *)instr->m_src1;
  OVar5 = IR::Opnd::GetKind((Opnd *)pIVar14);
  if (OVar5 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar6) goto LAB_005b21f2;
    *puVar9 = 0;
  }
  uVar7 = IR::IntConstOpnd::AsUint32(pIVar14);
  iVar10 = JITTimeFunctionBody::GetIsInstInlineCache(this_00,uVar7);
  pOVar1 = instr->m_src2;
  OVar5 = IR::Opnd::GetKind(pOVar1);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar6) goto LAB_005b21f2;
    *puVar9 = 0;
  }
  if (((ulong)pOVar1[1]._vptr_Opnd[3] & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5b57,"(instr->GetSrc2()->AsRegOpnd()->m_sym->m_isSingleDef)",
                       "instr->GetSrc2()->AsRegOpnd()->m_sym->m_isSingleDef");
    if (!bVar6) goto LAB_005b21f2;
    *puVar9 = 0;
  }
  pOVar1 = instr->m_src2;
  OVar5 = IR::Opnd::GetKind(pOVar1);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar6) goto LAB_005b21f2;
    *puVar9 = 0;
  }
  p_Var2 = pOVar1[1]._vptr_Opnd[5];
  pOVar1 = *(Opnd **)(p_Var2 + 0x48);
  pOVar3 = *(Opnd **)(p_Var2 + 0x50);
  OVar5 = IR::Opnd::GetKind(pOVar3);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar6) goto LAB_005b21f2;
    *puVar9 = 0;
  }
  if (((ulong)pOVar3[1]._vptr_Opnd[3] & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5b5b,"(instrArg->GetSrc2()->AsRegOpnd()->m_sym->m_isSingleDef)",
                       "instrArg->GetSrc2()->AsRegOpnd()->m_sym->m_isSingleDef");
    if (!bVar6) goto LAB_005b21f2;
    *puVar9 = 0;
  }
  pOVar3 = *(Opnd **)(p_Var2 + 0x50);
  OVar5 = IR::Opnd::GetKind(pOVar3);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar6) goto LAB_005b21f2;
    *puVar9 = 0;
  }
  p_Var2 = pOVar3[1]._vptr_Opnd[5];
  pOVar3 = *(Opnd **)(p_Var2 + 0x48);
  if (*(long *)(p_Var2 + 0x50) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5b5f,"(instrArg->GetSrc2() == nullptr)","instrArg->GetSrc2() == nullptr");
    if (!bVar6) {
LAB_005b21f2:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  pLVar15 = (Lowerer *)instr->m_dst;
  iVar8 = (*instr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[3])();
  src = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar8),AddrOpndKindDynamicVar,instr->m_func,true,
                          (Var)0x0);
  InsertMove((Opnd *)pLVar15,&src->super_Opnd,instr,true);
  pRVar11 = GetRegOpnd(pLVar15,pOVar3,instr,this->m_func,TyInt64);
  uVar7 = Js::IsInstInlineCache::OffsetOfFunction();
  pMVar12 = IR::MemRefOpnd::New((ulong)uVar7 + iVar10,TyInt64,this->m_func,
                                AddrOpndKindDynamicIsInstInlineCacheFunctionRef);
  InsertCompare(&pRVar11->super_Opnd,&pMVar12->super_Opnd,instr);
  pLVar15 = (Lowerer *)0xd;
  InsertBranch(BrNeq_A,false,target,instr);
  pRVar11 = GetRegOpnd(pLVar15,pOVar1,instr,this->m_func,TyInt64);
  LowererMD::GenerateObjectTest(&this->m_lowererMD,&pRVar11->super_Opnd,instr,labelTarget,false);
  pIVar13 = IR::IndirOpnd::New(pRVar11,8,TyInt64,this->m_func,false);
  InsertMove(&baseOpnd->super_Opnd,&pIVar13->super_Opnd,instr,true);
  uVar7 = Js::Type::GetOffsetOfTypeId();
  pIVar13 = IR::IndirOpnd::New(baseOpnd,uVar7,TyInt32,this->m_func,false);
  pIVar14 = IR::IntConstOpnd::New(0x16,TyInt32,this->m_func,false);
  InsertCompare(&pIVar13->super_Opnd,&pIVar14->super_Opnd,instr);
  InsertBranch(BrLe_A,false,labelTarget,instr);
  uVar7 = Js::IsInstInlineCache::OffsetOfType();
  pMVar12 = IR::MemRefOpnd::New((ulong)uVar7 + iVar10,TyInt64,this->m_func,
                                AddrOpndKindDynamicIsInstInlineCacheTypeRef);
  InsertCompare(&baseOpnd->super_Opnd,&pMVar12->super_Opnd,instr);
  InsertBranch(BrNeq_A,false,target,instr);
  uVar7 = Js::IsInstInlineCache::OffsetOfResult();
  pMVar12 = IR::MemRefOpnd::New((ulong)uVar7 + iVar10,TyInt64,this->m_func,
                                AddrOpndKindDynamicIsInstInlineCacheResultRef);
  InsertMove(instr->m_dst,&pMVar12->super_Opnd,instr,true);
  InsertBranch(Br,false,labelTarget,instr);
  IR::Instr::InsertBefore(instr,&target->super_Instr);
  IR::Instr::InsertAfter(instr,&labelTarget->super_Instr);
  return true;
}

Assistant:

bool
Lowerer::GenerateFastIsInst(IR::Instr * instr)
{
    IR::LabelInstr * helper = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::LabelInstr * done = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    IR::RegOpnd * typeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
    IR::Opnd * objectSrc;
    IR::Opnd * functionSrc;
    intptr_t inlineCache;
    IR::Instr * instrArg;

    // We are going to use the extra ArgOut_A instructions to lower the helper call later,
    // so we leave them alone here and clean them up then.
    inlineCache = instr->m_func->GetJITFunctionBody()->GetIsInstInlineCache(instr->GetSrc1()->AsIntConstOpnd()->AsUint32());
    Assert(instr->GetSrc2()->AsRegOpnd()->m_sym->m_isSingleDef);
    instrArg = instr->GetSrc2()->AsRegOpnd()->m_sym->m_instrDef;

    objectSrc = instrArg->GetSrc1();
    Assert(instrArg->GetSrc2()->AsRegOpnd()->m_sym->m_isSingleDef);
    instrArg = instrArg->GetSrc2()->AsRegOpnd()->m_sym->m_instrDef;

    functionSrc = instrArg->GetSrc1();
    Assert(instrArg->GetSrc2() == nullptr);

    // MOV dst, Js::false
    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse), instr);

    IR::RegOpnd * functionReg = GetRegOpnd(functionSrc, instr, m_func, TyMachReg);

    // CMP functionReg, [&(inlineCache->function)]
    {
        IR::Opnd* cacheFunction = IR::MemRefOpnd::New(inlineCache + Js::IsInstInlineCache::OffsetOfFunction(), TyMachReg, m_func, IR::AddrOpndKindDynamicIsInstInlineCacheFunctionRef);
        InsertCompare(functionReg, cacheFunction, instr);
    }

    // JNE helper
    InsertBranch(Js::OpCode::BrNeq_A, helper, instr);

    IR::RegOpnd * objectReg = GetRegOpnd(objectSrc, instr, m_func, TyMachReg);

    // TEST objectReg, Js::AtomTag
    // JNE done
    m_lowererMD.GenerateObjectTest(objectReg, instr, done);

    // MOV typeReg, objectSrc + offsetof(RecyclableObject::type)
    InsertMove(typeReg, IR::IndirOpnd::New(objectReg, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, m_func), instr);

    // CMP [typeReg + offsetof(Type::typeid)], TypeIds_LastJavascriptPrimitiveType
    {
        IR::IndirOpnd * typeId = IR::IndirOpnd::New(typeReg, Js::Type::GetOffsetOfTypeId(), TyInt32, m_func);
        IR::IntConstOpnd * lastPrimitive = IR::IntConstOpnd::New(Js::TypeId::TypeIds_LastJavascriptPrimitiveType, TyInt32, m_func);
        InsertCompare(typeId, lastPrimitive, instr);
    }

    // JLE done
    InsertBranch(Js::OpCode::BrLe_A, done, instr);

    // CMP typeReg, [&(inlineCache->type]
    {
        IR::Opnd * cacheType = IR::MemRefOpnd::New(inlineCache + Js::IsInstInlineCache::OffsetOfType(), TyMachReg, m_func, IR::AddrOpndKindDynamicIsInstInlineCacheTypeRef);
        InsertCompare(typeReg, cacheType, instr);
    }

    // JNE helper
    InsertBranch(Js::OpCode::BrNeq_A, helper, instr);

    // MOV dst, [&(inlineCache->result)]
    {
        IR::Opnd * cacheResult = IR::MemRefOpnd::New(inlineCache + Js::IsInstInlineCache::OffsetOfResult(), TyMachReg, m_func, IR::AddrOpndKindDynamicIsInstInlineCacheResultRef);
        InsertMove(instr->GetDst(), cacheResult, instr);
    }

    // JMP done
    InsertBranch(Js::OpCode::Br, done, instr);

    // LABEL helper
    instr->InsertBefore(helper);

    instr->InsertAfter(done);

    return true;
}